

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O2

int __thiscall QuadraticFunctor::operator()(QuadraticFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  CoeffReturnType pdVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  int i;
  long row;
  
  row = 0;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,0);
  dVar1 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,1);
  dVar2 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,2);
  dVar3 = *pdVar6;
  do {
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        &this->measuredValues,row,0);
    dVar4 = *pdVar7;
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        &this->measuredValues,row,1);
    dVar5 = *pdVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,row);
    *pSVar8 = dVar5 - (dVar1 * dVar4 * dVar4 + dVar2 * dVar4 + dVar3);
    row = row + 1;
  } while( true );
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fvec' has dimensions m x 1
        // It will contain the error for each data point.

        double aParam = x(0);
        double bParam = x(1);
        double cParam = x(2);

        for (int i = 0; i < values(); i++)
        {
            double xValue = measuredValues(i, 0);
            double yValue = measuredValues(i, 1);

            fvec(i) = yValue - (aParam * xValue * xValue + bParam * xValue + cParam);
        }
    }